

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

Fl_Widget * __thiscall Fl_Widget_Type::enter_live_mode(Fl_Widget_Type *this,int param_1)

{
  Fl_Widget *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  
  pFVar1 = this->o;
  iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x29])
                    (this,(ulong)(uint)pFVar1->x_,(ulong)(uint)pFVar1->y_,(ulong)(uint)pFVar1->w_,
                     (ulong)(uint)pFVar1->h_);
  this->live_widget = (Fl_Widget *)CONCAT44(extraout_var,iVar2);
  if ((Fl_Widget *)CONCAT44(extraout_var,iVar2) != (Fl_Widget *)0x0) {
    (*(this->super_Fl_Type)._vptr_Fl_Type[0x15])(this);
  }
  return this->live_widget;
}

Assistant:

Fl_Widget *Fl_Widget_Type::enter_live_mode(int) {
  live_widget = widget(o->x(), o->y(), o->w(), o->h());
  if (live_widget)
    copy_properties();
  return live_widget;
}